

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

array * __thiscall mpt::array::operator=(array *this,array *a)

{
  reference<mpt::array::content>::operator=(&this->_buf,&a->_buf);
  return this;
}

Assistant:

array &array::operator= (const array &a)
{
	_buf = a._buf;
	return *this;
}